

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

int compare_list(char **name,void **list,zip_uint64_t *list_length,int element_size,
                _func_int_void_ptr_void_ptr *cmp,_func_int_void_ptr_int_void_ptr *ignore,
                _func_int_char_ptr_ptr_void_ptr_void_ptr *check,_func_void_char_void_ptr *print,
                _func_void_void_ptr *start_file)

{
  uint uVar1;
  int iVar2;
  char cVar3;
  bool bVar4;
  void *local_b0;
  void *local_90;
  void *local_70;
  uint local_48;
  int c;
  int diff;
  int j;
  uint i [2];
  _func_int_void_ptr_int_void_ptr *ignore_local;
  _func_int_void_ptr_void_ptr *cmp_local;
  int element_size_local;
  zip_uint64_t *list_length_local;
  void **list_local;
  char **name_local;
  
  i = (uint  [2])ignore;
  j = 0;
  diff = 0;
  local_48 = 0;
LAB_00103503:
  do {
    bVar4 = false;
    if ((ulong)(uint)diff < *list_length) {
      bVar4 = (ulong)(uint)j < list_length[1];
    }
    if (!bVar4) {
      c = 0;
      do {
        if (1 < c) {
          return local_48;
        }
        while ((ulong)(uint)(&diff)[c] < list_length[c]) {
          if (i == (uint  [2])0x0) {
LAB_0010386a:
            cVar3 = '-';
            if (c != 0) {
              cVar3 = '+';
            }
            (*print)(cVar3,list[c]);
            if (c == 0) {
              minus_count = minus_count + 1;
            }
            else {
              plus_count = plus_count + 1;
            }
            local_48 = 1;
          }
          else {
            if ((ulong)(uint)(&diff)[1 - c] < list_length[1 - c]) {
              local_b0 = list[1 - c];
            }
            else {
              local_b0 = (void *)0x0;
            }
            iVar2 = (*(code *)i)(list[c],list_length[c] - 1 <= (ulong)(uint)(&diff)[c],local_b0);
            if (iVar2 == 0) goto LAB_0010386a;
          }
          (&diff)[c] = (&diff)[c] + 1;
          list[c] = (void *)((long)list[c] + (long)element_size);
        }
        c = c + 1;
      } while( true );
    }
    iVar2 = (*cmp)(*list,list[1]);
    if (iVar2 == 0) {
      if (check != (_func_int_char_ptr_ptr_void_ptr_void_ptr *)0x0) {
        if (start_file != (_func_void_void_ptr *)0x0) {
          (*start_file)(*list);
        }
        uVar1 = (*check)(name,*list,list[1]);
        local_48 = uVar1 | local_48;
        if (start_file != (_func_void_void_ptr *)0x0) {
          diff_output_end_file(&output);
        }
      }
      diff = diff + 1;
      *list = (void *)((long)*list + (long)element_size);
      j = j + 1;
      list[1] = (void *)((long)list[1] + (long)element_size);
      goto LAB_00103503;
    }
    if (iVar2 < 0) {
      if (i == (uint  [2])0x0) {
LAB_00103664:
        (*print)('-',*list);
        minus_count = minus_count + 1;
        local_48 = 1;
      }
      else {
        if ((ulong)(uint)j < list_length[1]) {
          local_70 = list[1];
        }
        else {
          local_70 = (void *)0x0;
        }
        iVar2 = (*(code *)i)(*list,*list_length - 1 <= (ulong)(uint)diff,local_70);
        if (iVar2 == 0) goto LAB_00103664;
      }
      diff = diff + 1;
      *list = (void *)((long)*list + (long)element_size);
    }
    else {
      if (i == (uint  [2])0x0) {
LAB_0010372b:
        (*print)('+',list[1]);
        plus_count = plus_count + 1;
        local_48 = 1;
      }
      else {
        if ((ulong)(uint)diff < *list_length) {
          local_90 = *list;
        }
        else {
          local_90 = (void *)0x0;
        }
        iVar2 = (*(code *)i)(list[1],list_length[1] - 1 <= (ulong)(uint)j,local_90);
        if (iVar2 == 0) goto LAB_0010372b;
      }
      j = j + 1;
      list[1] = (void *)((long)list[1] + (long)element_size);
    }
  } while( true );
}

Assistant:

static int
compare_list(char *const name[2], const void *list[2], const zip_uint64_t list_length[2], int element_size, int (*cmp)(const void *a, const void *b), int (*ignore)(const void *list, int last, const void *other), int (*check)(char *const name[2], const void *a, const void *b), void (*print)(char side, const void *element), void (*start_file)(const void *element)) {
    unsigned int i[2];
    int j;
    int diff;

#define INC(k) (i[k]++, list[k] = ((const char *)list[k]) + element_size)
#define PRINT(k)                                                                                                         \
    do {                                                                                                                 \
        if (ignore && ignore(list[k], i[k] >= list_length[k] - 1, i[1 - k] < list_length[1 - k] ? list[1 - k] : NULL)) { \
            break;                                                                                                       \
        }                                                                                                                \
        print((k) ? '+' : '-', list[k]);                                                                                 \
        (k) ? plus_count++ : minus_count++;                                                                              \
        diff = 1;                                                                                                        \
    } while (0)

    i[0] = i[1] = 0;
    diff = 0;
    while (i[0] < list_length[0] && i[1] < list_length[1]) {
        int c = cmp(list[0], list[1]);

        if (c == 0) {
            if (check) {
                if (start_file) {
                    start_file(list[0]);
                }
                diff |= check(name, list[0], list[1]);
                if (start_file) {
                    diff_output_end_file(&output);
                }
            }
            INC(0);
            INC(1);
        }
        else if (c < 0) {
            PRINT(0);
            INC(0);
        }
        else {
            PRINT(1);
            INC(1);
        }
    }

    for (j = 0; j < 2; j++) {
        while (i[j] < list_length[j]) {
            PRINT(j);
            INC(j);
        }
    }

    return diff;
}